

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

void __thiscall BronKerbosch::printEdges(BronKerbosch *this,string *filename)

{
  ostream *poVar1;
  string *in_RSI;
  alignment_set_t *in_RDI;
  alignment_set_t node;
  uint i;
  ofstream edgefile;
  AlignmentRecord *in_stack_fffffffffffffd58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffd78;
  BronKerbosch *in_stack_fffffffffffffd80;
  string local_268 [84];
  uint local_214;
  undefined1 local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  for (local_214 = 0;
      (pointer)(ulong)local_214 <
      in_RDI[1].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish; local_214 = local_214 + 1) {
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)in_RDI[3].m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,(ulong)local_214);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (in_stack_fffffffffffffd60,
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffd58);
    poVar1 = (ostream *)std::ostream::operator<<(local_210,local_214);
    in_stack_fffffffffffffd60 =
         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::operator<<(poVar1,":");
    std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::operator[]
              ((vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)(in_RDI + 2),
               (ulong)local_214);
    AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd58 =
         (AlignmentRecord *)std::operator<<((ostream *)in_stack_fffffffffffffd60,local_268);
    std::operator<<((ostream *)in_stack_fffffffffffffd58," ->");
    std::__cxx11::string::~string(local_268);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (in_stack_fffffffffffffd60,
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffd58);
    printSet(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_RDI);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257b4b);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257b55);
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void BronKerbosch::printEdges(std::string filename) {
    ofstream edgefile(filename, ofstream::out);

    for(unsigned int i = 0; i < alignment_count; i++) {
        alignment_set_t node = (*vertices_)[i];
        edgefile << i << ":" << alignments_[i]->getName() << " ->";
        
        printSet(edgefile, node);
    }
}